

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O3

bool __thiscall
caffe::FillerParameter::MergePartialFromCodedStream(FillerParameter *this,CodedInputStream *input)

{
  InternalMetadataWithArena *this_00;
  byte bVar1;
  byte *pbVar2;
  void *pvVar3;
  float *pfVar4;
  ArenaStringPtr *pAVar5;
  bool bVar6;
  uint32 uVar7;
  int64 iVar8;
  UnknownFieldSet *pUVar9;
  char cVar10;
  uint uVar11;
  ulong uVar12;
  string *value;
  float fVar13;
  float local_3c;
  ArenaStringPtr *local_38;
  
  this_00 = &this->_internal_metadata_;
  local_38 = &this->type_;
LAB_003ac606:
  do {
    pbVar2 = input->buffer_;
    uVar7 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar7 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_003ac629;
      input->buffer_ = pbVar2 + 1;
      uVar12 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_003ac629:
      uVar7 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar7);
      uVar12 = 0;
      if (uVar7 - 1 < 0x7f) {
        uVar12 = 0x100000000;
      }
      uVar12 = uVar7 | uVar12;
    }
    pAVar5 = local_38;
    uVar11 = (uint)uVar12;
    if ((uVar12 & 0x100000000) != 0) {
      cVar10 = (char)uVar12;
      switch((uint)(uVar12 >> 3) & 0x1fffffff) {
      case 1:
        if (cVar10 == '\n') {
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
          value = (this->type_).ptr_;
          if (value == (string *)&_default_type__abi_cxx11_) {
            google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                      (local_38,(string *)&_default_type__abi_cxx11_);
            value = pAVar5->ptr_;
          }
          bVar6 = google::protobuf::internal::WireFormatLite::ReadBytes(input,value);
          if (!bVar6) {
            return false;
          }
          google::protobuf::internal::WireFormatLite::VerifyUtf8String
                    ((local_38->ptr_->_M_dataplus)._M_p,(int)local_38->ptr_->_M_string_length,PARSE,
                     "caffe.FillerParameter.type");
          goto LAB_003ac606;
        }
        break;
      case 2:
        if (cVar10 == '\x15') {
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
          pfVar4 = (float *)input->buffer_;
          if (*(int *)&input->buffer_end_ - (int)pfVar4 < 4) {
            bVar6 = google::protobuf::io::CodedInputStream::ReadLittleEndian32Fallback
                              (input,(uint32 *)&local_3c);
            fVar13 = local_3c;
            if (!bVar6) {
              return false;
            }
          }
          else {
            fVar13 = *pfVar4;
            input->buffer_ = (uint8 *)(pfVar4 + 1);
          }
          this->value_ = fVar13;
          goto LAB_003ac606;
        }
        break;
      case 3:
        if (cVar10 == '\x1d') {
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 4;
          pfVar4 = (float *)input->buffer_;
          if (*(int *)&input->buffer_end_ - (int)pfVar4 < 4) {
            bVar6 = google::protobuf::io::CodedInputStream::ReadLittleEndian32Fallback
                              (input,(uint32 *)&local_3c);
            fVar13 = local_3c;
            if (!bVar6) {
              return false;
            }
          }
          else {
            fVar13 = *pfVar4;
            input->buffer_ = (uint8 *)(pfVar4 + 1);
          }
          this->min_ = fVar13;
          goto LAB_003ac606;
        }
        break;
      case 4:
        if (cVar10 == '%') {
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x40;
          pfVar4 = (float *)input->buffer_;
          if (*(int *)&input->buffer_end_ - (int)pfVar4 < 4) {
            bVar6 = google::protobuf::io::CodedInputStream::ReadLittleEndian32Fallback
                              (input,(uint32 *)&local_3c);
            fVar13 = local_3c;
            if (!bVar6) {
              return false;
            }
          }
          else {
            fVar13 = *pfVar4;
            input->buffer_ = (uint8 *)(pfVar4 + 1);
          }
          this->max_ = fVar13;
          goto LAB_003ac606;
        }
        break;
      case 5:
        if (cVar10 == '-') {
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 8;
          pfVar4 = (float *)input->buffer_;
          if (*(int *)&input->buffer_end_ - (int)pfVar4 < 4) {
            bVar6 = google::protobuf::io::CodedInputStream::ReadLittleEndian32Fallback
                              (input,(uint32 *)&local_3c);
            fVar13 = local_3c;
            if (!bVar6) {
              return false;
            }
          }
          else {
            fVar13 = *pfVar4;
            input->buffer_ = (uint8 *)(pfVar4 + 1);
          }
          this->mean_ = fVar13;
          goto LAB_003ac606;
        }
        break;
      case 6:
        if (cVar10 == '5') {
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x80;
          pfVar4 = (float *)input->buffer_;
          if (*(int *)&input->buffer_end_ - (int)pfVar4 < 4) {
            bVar6 = google::protobuf::io::CodedInputStream::ReadLittleEndian32Fallback
                              (input,(uint32 *)&local_3c);
            fVar13 = local_3c;
            if (!bVar6) {
              return false;
            }
          }
          else {
            fVar13 = *pfVar4;
            input->buffer_ = (uint8 *)(pfVar4 + 1);
          }
          this->std_ = fVar13;
          goto LAB_003ac606;
        }
        break;
      case 7:
        if (cVar10 == '8') {
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x20;
          pbVar2 = input->buffer_;
          if (pbVar2 < input->buffer_end_) {
            bVar1 = *pbVar2;
            uVar12 = (ulong)bVar1;
            uVar7 = (uint32)bVar1;
            if ((char)bVar1 < '\0') goto LAB_003ac95b;
            input->buffer_ = pbVar2 + 1;
          }
          else {
            uVar7 = 0;
LAB_003ac95b:
            uVar12 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar7);
            if ((long)uVar12 < 0) {
              return false;
            }
          }
          this->sparse_ = (int32)uVar12;
          goto LAB_003ac606;
        }
        break;
      case 8:
        if (cVar10 == '@') {
          pbVar2 = input->buffer_;
          if (pbVar2 < input->buffer_end_) {
            bVar1 = *pbVar2;
            uVar7 = (uint32)bVar1;
            uVar11 = (uint)bVar1;
            if ((char)bVar1 < '\0') goto LAB_003ac8db;
            input->buffer_ = pbVar2 + 1;
          }
          else {
            uVar7 = 0;
LAB_003ac8db:
            iVar8 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar7);
            uVar11 = (uint)iVar8;
            if (iVar8 < 0) {
              return false;
            }
          }
          if (uVar11 < 3) {
            *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x10;
            this->variance_norm_ = uVar11;
          }
          else {
            pvVar3 = (this_00->
                     super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                     ).ptr_;
            if (((ulong)pvVar3 & 1) == 0) {
              pUVar9 = google::protobuf::internal::
                       InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                       ::mutable_unknown_fields_slow
                                 (&this_00->
                                   super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                                 );
            }
            else {
              pUVar9 = (UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe);
            }
            google::protobuf::UnknownFieldSet::AddVarint(pUVar9,8,(long)(int)uVar11);
          }
          goto LAB_003ac606;
        }
      }
    }
    if (uVar11 == 0) {
      return true;
    }
    if ((uVar11 & 7) == 4) {
      return true;
    }
    pvVar3 = (this_00->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_;
    if (((ulong)pvVar3 & 1) == 0) {
      pUVar9 = google::protobuf::internal::
               InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ::mutable_unknown_fields_slow
                         (&this_00->
                           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         );
    }
    else {
      pUVar9 = (UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe);
    }
    bVar6 = google::protobuf::internal::WireFormat::SkipField(input,uVar11,pUVar9);
    if (!bVar6) {
      return false;
    }
  } while( true );
}

Assistant:

bool FillerParameter::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:caffe.FillerParameter)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional string type = 1 [default = "constant"];
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_type()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->type().data(), this->type().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "caffe.FillerParameter.type");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional float value = 2 [default = 0];
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(21u)) {
          set_has_value();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, &value_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional float min = 3 [default = 0];
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(29u)) {
          set_has_min();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, &min_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional float max = 4 [default = 1];
      case 4: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(37u)) {
          set_has_max();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, &max_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional float mean = 5 [default = 0];
      case 5: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(45u)) {
          set_has_mean();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, &mean_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional float std = 6 [default = 1];
      case 6: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(53u)) {
          set_has_std();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, &std_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional int32 sparse = 7 [default = -1];
      case 7: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(56u)) {
          set_has_sparse();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &sparse_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.FillerParameter.VarianceNorm variance_norm = 8 [default = FAN_IN];
      case 8: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(64u)) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          if (::caffe::FillerParameter_VarianceNorm_IsValid(value)) {
            set_variance_norm(static_cast< ::caffe::FillerParameter_VarianceNorm >(value));
          } else {
            mutable_unknown_fields()->AddVarint(8, value);
          }
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:caffe.FillerParameter)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:caffe.FillerParameter)
  return false;
#undef DO_
}